

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O0

int wrtwrn(FILE *out,char *mess,int isheasarc)

{
  int in_EDX;
  char *in_RSI;
  int in_stack_00000054;
  char *in_stack_00000058;
  FILE *in_stack_00000060;
  int local_4;
  
  if (err_report == 0) {
    if ((heasarc_conv == 0) && (in_EDX != 0)) {
      local_4 = 0;
    }
    else {
      nwrns = nwrns + 1;
      strcpy(temp,"*** Warning: ");
      strcat(temp,in_RSI);
      if (in_EDX != 0) {
        strcat(temp," (HEASARC Convention)");
      }
      print_fmt(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      local_4 = nwrns;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int wrtwrn(FILE *out, char *mess, int isheasarc)
{
    if(err_report) return 0;           /* Don't print the warnings */    
    if(!heasarc_conv && isheasarc) return 0;  /* heasarc warnings  but with
                                                 heasarc convention turns off */
    nwrns++;
    strcpy(temp,"*** Warning: ");
    strcat(temp,mess);
    if(isheasarc) strcat(temp," (HEASARC Convention)");
    print_fmt(out,temp,13);
/*    if(nwrns > MAXWRNS ) { 
	 fprintf(stderr,"??? Too many Warnings! I give up...\n");
          
    }  */
    return nwrns;
}